

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O3

Violation __thiscall
mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<2>>>::
ComputeViolation<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<2>>>
           *this,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  double dVar1;
  int iVar2;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_RDX;
  longdouble in_ST0;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Violation VVar7;
  
  QuadAndLinTerms::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
            ((longdouble *)(this + 0x48),(QuadAndLinTerms *)x,in_RDX);
  dVar1 = (double)in_ST0;
  dVar4 = *(double *)(this + 0x200);
  dVar6 = dVar4 - dVar1;
  dVar3 = dVar6;
  if (dVar4 <= dVar1) {
    dVar3 = dVar1 + -INFINITY;
    if (dVar1 + -INFINITY <= dVar6) {
      dVar3 = dVar6;
    }
    dVar4 = 0.0;
  }
  dVar1 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[*(int *)(this + 0x20)];
  iVar2 = *(int *)(this + 0x24);
  if (iVar2 == 2) {
    dVar6 = dVar3;
    dVar5 = dVar4;
    if (dVar1 < 0.5 || dVar3 <= 0.0) {
      dVar6 = 0.0;
      dVar5 = 0.0;
    }
  }
  else if (iVar2 == 3) {
    dVar6 = 0.0;
    if (0.0 < dVar3) {
      dVar5 = 0.0;
    }
    else {
      dVar5 = 0.0;
      if (dVar1 < 0.5) {
        dVar6 = -dVar3;
        dVar5 = dVar4;
      }
    }
  }
  else if (iVar2 == 4) {
    dVar6 = 0.0;
    dVar5 = 0.0;
    if (dVar3 <= 0.0 != 0.5 <= dVar1) {
      dVar6 = ABS(dVar3);
      dVar5 = dVar4;
    }
  }
  else {
    dVar6 = INFINITY;
    dVar5 = 0.0;
  }
  VVar7.valX_ = dVar5;
  VVar7.viol_ = dVar6;
  return VVar7;
}

Assistant:

Violation ComputeViolation(const VarVec& x) {
    auto viol = GetConstraint().ComputeViolation(x);
    bool ccon_valid = viol.viol_<=0.0;
    bool has_arg = x[GetResultVar()] >= 0.5;
    switch (this->GetContext().GetValue()) {
    case Context::CTX_MIX:    // Viol is non-positive if holds
      if (has_arg == ccon_valid)
        return {0.0, 0.0};
      return {std::fabs(viol.viol_), viol.valX_};
    case Context::CTX_POS:
      if (has_arg <= ccon_valid)
        return {0.0, 0.0};
      return {viol.viol_, viol.valX_};
    case Context::CTX_NEG:
      if (has_arg >= ccon_valid)
        return {0.0, 0.0};
      return {-viol.viol_, viol.valX_};
    default:
      return {INFINITY, 0.0};
    }
  }